

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rep.c
# Opt level: O0

int nn_rep_create(void *hint,nn_sockbase **sockbase)

{
  nn_sockbase_vfptr *vfptr;
  nn_rep *in_RSI;
  nn_rep *self;
  
  vfptr = (nn_sockbase_vfptr *)nn_alloc_(0x12f4d8);
  if (vfptr == (nn_sockbase_vfptr *)0x0) {
    nn_backtrace_print();
    fprintf(_stderr,"Out of memory (%s:%d)\n",
            "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/protocols/reqrep/rep.c"
            ,0x93);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_rep_init(in_RSI,vfptr,(void *)0x12f547);
  (in_RSI->xrep).sockbase.vfptr = vfptr;
  return 0;
}

Assistant:

static int nn_rep_create (void *hint, struct nn_sockbase **sockbase)
{
    struct nn_rep *self;

    self = nn_alloc (sizeof (struct nn_rep), "socket (rep)");
    alloc_assert (self);
    nn_rep_init (self, &nn_rep_sockbase_vfptr, hint);
    *sockbase = &self->xrep.sockbase;

    return 0;
}